

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_request.cpp
# Opt level: O0

HTTPRequest * __thiscall HTTPRequest::str_abi_cxx11_(HTTPRequest *this)

{
  char *pcVar1;
  ulong uVar2;
  bool bVar3;
  type *__rhs;
  char *in_RSI;
  allocator local_151;
  string local_150 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0 [32];
  reference local_d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *i;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [39];
  undefined1 local_19;
  HTTPRequest *this_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *result;
  
  local_19 = 0;
  this_local = this;
  std::operator+(local_a0,in_RSI);
  std::operator+(local_80,local_a0);
  std::operator+(local_60,(char *)local_80);
  std::operator+(local_40,local_60);
  std::operator+(&this->method,(char *)local_40);
  std::__cxx11::string::~string((string *)local_40);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string((string *)local_a0);
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)(in_RSI + 0x60));
  i = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)(in_RSI + 0x60));
  while (bVar3 = std::operator!=(&__end1,(_Self *)&i), bVar3) {
    local_d0 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator*(&__end1);
    __rhs = std::get<0ul,std::__cxx11::string_const,std::__cxx11::string>(local_d0);
    std::operator+(local_130,(char *)__rhs);
    std::get<1ul,std::__cxx11::string_const,std::__cxx11::string>(local_d0);
    std::operator+(local_110,local_130);
    std::operator+(local_f0,(char *)local_110);
    std::__cxx11::string::operator+=((string *)this,(string *)local_f0);
    std::__cxx11::string::~string((string *)local_f0);
    std::__cxx11::string::~string((string *)local_110);
    std::__cxx11::string::~string((string *)local_130);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&__end1);
  }
  if (0 < *(long *)(in_RSI + 0x98)) {
    pcVar1 = *(char **)(in_RSI + 0x90);
    uVar2 = *(ulong *)(in_RSI + 0x98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_150,pcVar1,uVar2,&local_151);
    std::__cxx11::string::operator+=((string *)this,local_150);
    std::__cxx11::string::~string(local_150);
    std::allocator<char>::~allocator((allocator<char> *)&local_151);
  }
  return this;
}

Assistant:

std::string HTTPRequest::str() {
    auto result = this->method + " " + this->uri + " " + this->version + "\n";
    for (auto && i : this->header) {
        result += std::get<0>(i) + ": " + std::get<1>(i) + "\n";
    }
    if (this->content_length > 0) {
        result += std::string(this->content, this->content_length * sizeof(char));
    }
    return result;
}